

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_fixed_header_rule_violation(mqtt_fixed_header *fixed_header)

{
  byte bVar1;
  uint8_t mask_required_flags;
  uint8_t required_flags;
  uint8_t control_flags;
  uint8_t control_type;
  mqtt_fixed_header *fixed_header_local;
  
  bVar1 = (byte)fixed_header->control_type;
  if (mqtt_fixed_header_rules.control_type_is_valid[bVar1] == '\0') {
    fixed_header_local = (mqtt_fixed_header *)0xffffffff80000002;
  }
  else if (((fixed_header->field_0x4 & 0xf ^ mqtt_fixed_header_rules.required_flags[bVar1]) &
           mqtt_fixed_header_rules.mask_required_flags[bVar1]) == 0) {
    fixed_header_local = (mqtt_fixed_header *)0x0;
  }
  else {
    fixed_header_local = (mqtt_fixed_header *)0xffffffff80000003;
  }
  return (ssize_t)fixed_header_local;
}

Assistant:

static ssize_t mqtt_fixed_header_rule_violation(const struct mqtt_fixed_header *fixed_header) {
    uint8_t control_type;
    uint8_t control_flags;
    uint8_t required_flags;
    uint8_t mask_required_flags;

    /* get value and rules */
    control_type = (uint8_t)fixed_header->control_type;
    control_flags = fixed_header->control_flags;
    required_flags = mqtt_fixed_header_rules.required_flags[control_type];
    mask_required_flags = mqtt_fixed_header_rules.mask_required_flags[control_type];

    /* check for valid type */
    if (!mqtt_fixed_header_rules.control_type_is_valid[control_type]) {
        return MQTT_ERROR_CONTROL_FORBIDDEN_TYPE;
    }
    
    /* check that flags are appropriate */
    if(MQTT_BITFIELD_RULE_VIOLOATION(control_flags, required_flags, mask_required_flags)) {
        return MQTT_ERROR_CONTROL_INVALID_FLAGS;
    }

    return 0;
}